

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_itoa_s(int value,char *dst,size_t dstSizeInBytes,int radix)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  
  if (dstSizeInBytes == 0 || dst == (char *)0x0) {
    return 0x16;
  }
  if (0xffffffdc < radix - 0x25U) {
    uVar4 = (ulong)(uint)-value;
    if (0 < value) {
      uVar4 = (ulong)(uint)value;
    }
    pcVar5 = dst;
    lVar7 = 0;
    do {
      uVar3 = (uint)uVar4;
      uVar2 = uVar4 % (ulong)(uint)radix;
      cVar6 = '0';
      if (9 < (int)uVar2) {
        cVar6 = 'W';
      }
      *pcVar5 = cVar6 + (char)uVar2;
      pcVar5 = pcVar5 + 1;
      lVar1 = lVar7 + -1;
    } while ((1 - dstSizeInBytes != lVar7) &&
            (uVar4 = uVar4 / (uint)radix, lVar7 = lVar1, (uint)radix <= uVar3));
    if (dstSizeInBytes + lVar1 != 0) {
      if (value < 0 && radix == 10) {
        *pcVar5 = '-';
        if (1 - dstSizeInBytes == lVar1) goto LAB_00152c63;
        pcVar5 = dst + (1 - lVar1);
      }
      *pcVar5 = '\0';
      for (; pcVar5 = pcVar5 + -1, dst < pcVar5; dst = dst + 1) {
        cVar6 = *dst;
        *dst = *pcVar5;
        *pcVar5 = cVar6;
      }
      return 0;
    }
  }
LAB_00152c63:
  *dst = '\0';
  return 0x16;
}

Assistant:

MA_API MA_NO_INLINE int ma_itoa_s(int value, char* dst, size_t dstSizeInBytes, int radix)
{
    int sign;
    unsigned int valueU;
    char* dstEnd;

    if (dst == NULL || dstSizeInBytes == 0) {
        return 22;
    }
    if (radix < 2 || radix > 36) {
        dst[0] = '\0';
        return 22;
    }

    sign = (value < 0 && radix == 10) ? -1 : 1;     /* The negative sign is only used when the base is 10. */

    if (value < 0) {
        valueU = -value;
    } else {
        valueU = value;
    }

    dstEnd = dst;
    do
    {
        int remainder = valueU % radix;
        if (remainder > 9) {
            *dstEnd = (char)((remainder - 10) + 'a');
        } else {
            *dstEnd = (char)(remainder + '0');
        }

        dstEnd += 1;
        dstSizeInBytes -= 1;
        valueU /= radix;
    } while (dstSizeInBytes > 0 && valueU > 0);

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    if (sign < 0) {
        *dstEnd++ = '-';
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    *dstEnd = '\0';


    /* At this point the string will be reversed. */
    dstEnd -= 1;
    while (dst < dstEnd) {
        char temp = *dst;
        *dst = *dstEnd;
        *dstEnd = temp;

        dst += 1;
        dstEnd -= 1;
    }

    return 0;
}